

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Value::set_allocated_immediatevalue
          (Value *this,Value_ImmediateValue *immediatevalue)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  Value_ImmediateValue *immediatevalue_local;
  Value *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_value(this);
  if (immediatevalue != (Value_ImmediateValue *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::
         InternalHelper<CoreML::Specification::MILSpec::Value_ImmediateValue>::GetOwningArena
                   (immediatevalue);
    message_arena = (Arena *)immediatevalue;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::MILSpec::Value_ImmediateValue>
                              (message_arena_00,immediatevalue,submessage_arena_00);
    }
    set_has_immediatevalue(this);
    (this->value_).immediatevalue_ = (Value_ImmediateValue *)message_arena;
  }
  return;
}

Assistant:

void Value::set_allocated_immediatevalue(::CoreML::Specification::MILSpec::Value_ImmediateValue* immediatevalue) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (immediatevalue) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::Value_ImmediateValue>::GetOwningArena(immediatevalue);
    if (message_arena != submessage_arena) {
      immediatevalue = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, immediatevalue, submessage_arena);
    }
    set_has_immediatevalue();
    value_.immediatevalue_ = immediatevalue;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.Value.immediateValue)
}